

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitAssignmentExpression
          (MethodSemanticAnalysis *this,AssignmentExpression *node)

{
  int iVar1;
  Node *pNVar2;
  IdentifierExpression *this_00;
  __shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2> *location;
  VariableLookupPtr variable;
  __shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  pNVar2 = AST::AssignmentExpression::getReference(node);
  (*pNVar2->_vptr_Node[2])(pNVar2,this);
  pNVar2 = AST::AssignmentExpression::getValue(node);
  (*pNVar2->_vptr_Node[2])(pNVar2,this);
  this_00 = (IdentifierExpression *)AST::AssignmentExpression::getReference(node);
  iVar1 = (*(this_00->super_Node)._vptr_Node[4])(this_00);
  if ((char)iVar1 == '\0') {
    fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
            "virtual Oop Lodtalk::MethodSemanticAnalysis::visitAssignmentExpression(AssignmentExpression *)"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
            ,0x2a5);
    abort();
  }
  location = &AST::IdentifierExpression::getVariable(this_00)->
              super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,location);
  iVar1 = (*((ASTVisitor *)&(local_20._M_ptr)->_vptr_VariableLookup)->_vptr_ASTVisitor[3])();
  if ((char)iVar1 != '\0') {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    return (Oop)&NilObject;
  }
  AbstractASTVisitor::error
            ((AbstractASTVisitor *)local_20._M_ptr,(Node *)location,
             "cannot perform an assignment into an immutable variable.");
}

Assistant:

Oop MethodSemanticAnalysis::visitAssignmentExpression(AssignmentExpression *node)
{
    // Visit the identifier.
    node->getReference()->acceptVisitor(this);

    // Visit the value.
    node->getValue()->acceptVisitor(this);

    // Ensure the reference is an identifier expression.
    auto reference = node->getReference();
    if(!reference->isIdentifierExpression())
    {
        LODTALK_UNIMPLEMENTED();
    }

    // Ensure the variable is mutable.
    auto identExpr = static_cast<AST::IdentifierExpression*> (reference);
    auto variable = identExpr-> getVariable();
    if(!variable->isMutable())
        error(node, "cannot perform an assignment into an immutable variable.");

    return Oop();
}